

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_set.hpp
# Opt level: O1

void __thiscall
duckdb::FunctionSet<duckdb::TableFunction>::~FunctionSet(FunctionSet<duckdb::TableFunction> *this)

{
  pointer pcVar1;
  
  std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&(this->functions).
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

explicit FunctionSet(string name) : name(std::move(name)) {
	}